

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

file_status
ghc::filesystem::detail::symlink_status_ex
          (path *p,error_code *ec,uintmax_t *sz,uintmax_t *nhl,time_t *lwt)

{
  int iVar1;
  int *piVar2;
  uintmax_t uVar3;
  file_status *f_s;
  stat fs;
  stat sStack_a8;
  
  iVar1 = lstat(*(char **)ec,&sStack_a8);
  if (iVar1 == 0) {
    uVar3 = std::_V2::system_category();
    *(undefined4 *)sz = 0;
    sz[1] = uVar3;
    file_status_from_st_mode<unsigned_int>((detail *)p,sStack_a8.st_mode);
  }
  else {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    uVar3 = std::_V2::system_category();
    *(int *)sz = iVar1;
    sz[1] = uVar3;
    if ((iVar1 == 0x14) || (iVar1 == 2)) {
      *(undefined4 *)&(p->_path)._M_dataplus._M_p = 1;
    }
    else {
      *(undefined4 *)&(p->_path)._M_dataplus._M_p = 0;
    }
    *(undefined2 *)((long)&(p->_path)._M_dataplus._M_p + 4) = 0xffff;
  }
  return (file_status)p;
}

Assistant:

GHC_INLINE file_status symlink_status_ex(const path& p, std::error_code& ec, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr) noexcept
{
#ifdef GHC_OS_WINDOWS
    file_status fs;
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!GetFileAttributesExW(detail::fromUtf8<std::wstring>(p.u8string()).c_str(), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else {
        ec.clear();
        fs = detail::status_from_INFO(p, &attr, ec, sz, lwt);
        if (nhl) {
            *nhl = 0;
        }
        if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
            fs.type(file_type::symlink);
        }
    }
    if (detail::is_not_found_error(ec)) {
        return file_status(file_type::not_found);
    }
    return ec ? file_status(file_type::none) : fs;
#else
    (void)sz;
    (void)nhl;
    (void)lwt;
    struct ::stat fs;
    auto result = ::lstat(p.c_str(), &fs);
    if (result == 0) {
        ec.clear();
        file_status f_s = detail::file_status_from_st_mode(fs.st_mode);
        return f_s;
    }
    ec = detail::make_system_error();
    if (detail::is_not_found_error(ec)) {
        return file_status(file_type::not_found, perms::unknown);
    }
    return file_status(file_type::none);
#endif
}